

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O2

Var __thiscall
Js::CrossSiteObject<Js::ConsoleScopeActivationObject>::GetHostDispatchVar
          (CrossSiteObject<Js::ConsoleScopeActivationObject> *this)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  undefined4 *puVar4;
  
  pvVar3 = RecyclableObject::GetHostDispatchVar((RecyclableObject *)this);
  if (pvVar3 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSiteObject.h"
                                ,0xfc,"(hostDispatch)","hostDispatch");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar3 = CrossSite::MarshalVar
                     ((((((this->super_ConsoleScopeActivationObject).super_ActivationObject.
                          super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                       ptr)->super_JavascriptLibraryBase).scriptContext.ptr,pvVar3,false);
  return pvVar3;
}

Assistant:

Var CrossSiteObject<T>::GetHostDispatchVar()
    {
        Var hostDispatch = __super::GetHostDispatchVar();
        AssertMsg(hostDispatch, "hostDispatch");
        hostDispatch = CrossSite::MarshalVar(this->GetScriptContext(), hostDispatch);
        return hostDispatch;
    }